

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O1

string * __thiscall
flatbuffers::python::PythonGenerator::GenFieldTy_abi_cxx11_
          (string *__return_storage_ptr__,PythonGenerator *this,FieldDef *field)

{
  BaseType BVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  string ty;
  allocator<char> local_31;
  long *local_30 [2];
  long local_20 [2];
  
  BVar1 = (field->value).type.base_type;
  if (BVar1 == BASE_TYPE_ARRAY || BVar1 - BASE_TYPE_UTYPE < 0xc) {
    if (BVar1 == BASE_TYPE_ARRAY) {
      BVar1 = (field->value).type.element;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_30,
               *(char **)(GenTypeBasic[abi:cxx11](flatbuffers::Type_const&)::ctypename +
                         (ulong)BVar1 * 8),&local_31);
    lVar3 = std::__cxx11::string::find((char *)local_30,0x368986,0);
    if (lVar3 == -1) {
      lVar3 = std::__cxx11::string::find((char *)local_30,0x360828,0);
      if (lVar3 == -1) {
        iVar2 = std::__cxx11::string::compare((char *)local_30);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if (iVar2 == 0) {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"bool","");
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"Any","")
          ;
        }
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"float","")
        ;
      }
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"int","");
    }
    if (local_30[0] != local_20) {
      operator_delete(local_30[0],local_20[0] + 1);
    }
  }
  else {
    if ((BVar1 == BASE_TYPE_STRUCT) && (((field->value).type.struct_def)->fixed == true)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = "Any";
      pcVar4 = "";
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = "int";
      pcVar4 = "";
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar5,pcVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenFieldTy(const FieldDef &field) const {
    if (IsScalar(field.value.type.base_type) || IsArray(field.value.type)) {
      const std::string ty = GenTypeBasic(field.value.type);
      if (ty.find("int") != std::string::npos) { return "int"; }

      if (ty.find("float") != std::string::npos) { return "float"; }

      if (ty == "bool") { return "bool"; }

      return "Any";
    } else {
      if (IsStruct(field.value.type)) {
        return "Any";
      } else {
        return "int";
      }
    }
  }